

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::factor(Parser *this)

{
  char cVar1;
  bool bVar2;
  InfixExprNode *this_00;
  ExprNode *pEVar3;
  ExprNode **ppEVar4;
  Token *this_01;
  Token t;
  Token op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  Token local_330;
  Token local_2c0;
  Token local_250;
  Token local_1e0;
  Token local_170;
  Token local_100;
  Token local_90;
  
  Tokenizer::getToken(&local_2c0,this->tokenizer);
  if (local_2c0._symbol == '-') {
    this_00 = (InfixExprNode *)operator_new(0x90);
    Token::Token(&local_1e0,&local_2c0);
    InfixExprNode::InfixExprNode(this_00,&local_1e0);
    Token::~Token(&local_1e0);
    Token::Token(&local_330);
    local_330._wholeNumber = 0.0;
    local_330._isWholeNumber = true;
    pEVar3 = (ExprNode *)operator_new(0x80);
    Token::Token(&local_250,&local_330);
    WholeNumber::WholeNumber((WholeNumber *)pEVar3,&local_250);
    ppEVar4 = InfixExprNode::left(this_00);
    *ppEVar4 = pEVar3;
    Token::~Token(&local_250);
    pEVar3 = factor(this);
    ppEVar4 = InfixExprNode::right(this_00);
    *ppEVar4 = pEVar3;
  }
  else {
    Tokenizer::getToken(&local_330,this->tokenizer);
    Tokenizer::ungetToken(this->tokenizer);
    if (local_330._symbol == '[') {
      this_00 = (InfixExprNode *)operator_new(0x88);
      this_01 = &local_90;
      Token::Token(this_01,&local_2c0);
      pEVar3 = sub(this);
      SubExpr::SubExpr((SubExpr *)this_00,this_01,pEVar3);
    }
    else {
      std::__cxx11::string::string((string *)&local_350,(string *)&local_2c0);
      bVar2 = std::operator==(&local_350,"len");
      cVar1 = local_330._symbol;
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_350);
        if (cVar1 == '(') {
          this_00 = (InfixExprNode *)len(this);
          goto LAB_00107eee;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_350);
      }
      if ((local_330._symbol == '(') && (local_2c0._name._M_string_length != 0)) {
        this_01 = &local_100;
        Token::Token(this_01,&local_2c0);
        this_00 = (InfixExprNode *)call(this,this_01);
      }
      else {
        this_01 = &local_170;
        Token::Token(this_01,&local_2c0);
        this_00 = (InfixExprNode *)atom(this,this_01);
      }
    }
    Token::~Token(this_01);
  }
LAB_00107eee:
  Token::~Token(&local_330);
  Token::~Token(&local_2c0);
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Parser::factor() {
    // factor: { - } factor | atom

    Token op = tokenizer.getToken();
    if(op.isSubtractionOperator()){
        auto* negativeNumber = new InfixExprNode(op);
        Token t;
        t.setWholeNumber(0);
        negativeNumber->left() = new WholeNumber(t);
        ExprNode* f = factor();
        negativeNumber->right() = f;
        return negativeNumber;
    } else{ //if(op.isName()) {
        //tokenizer.ungetToken();
        Token check = tokenizer.getToken();
        tokenizer.ungetToken();
        if(check.isOpenBrace()) {//subscription
            return new SubExpr(op,sub()); //ID[test]
        }else if(op.getName() == "len"
        && check.isOpenParen()){
            return len();
        }else if(check.isOpenParen() && op.isName()){// cal
            return call(op);
        }else {
            ExprNode *a = atom(op);
            return a;
        }

    }
}